

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

double __thiscall internalJSONNode::operator_cast_to_double(internalJSONNode *this)

{
  json_string *__lhs;
  uchar uVar1;
  json_number jVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  Fetch(this);
  uVar1 = this->_type;
  if (uVar1 == '\0') {
LAB_00117307:
    jVar2 = 0.0;
  }
  else {
    if (uVar1 == '\x01') {
      FetchNumber(this);
      uVar1 = this->_type;
    }
    else if (uVar1 == '\x03') {
      if ((this->_value)._bool != false) {
        return 1.0;
      }
      goto LAB_00117307;
    }
    __lhs = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&bStack_38,__lhs,"(double)");
    JSONDebug::_JSON_ASSERT(uVar1 == '\x02',&bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
    jVar2 = (this->_value)._number;
  }
  return jVar2;
}

Assistant:

internalJSONNode::operator double() const json_nothrow {
		  Fetch();
		  #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
			 switch(type()){
				case JSON_NULL:
				    return (double)0.0;
				case JSON_BOOL:
				    return (double)(_value._bool ? 1.0 : 0.0);
				case JSON_STRING:
				    FetchNumber();
			 }
		  #endif /*<- */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(double)"));
		  return (double)_value._number;
	   }